

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  value_type *local_38;
  value_type *local_28;
  ImDrawCmd *current_cmd;
  void *callback_data_local;
  ImDrawCallback callback_local;
  ImDrawList *this_local;
  
  if ((this->CmdBuffer).Size == 0) {
    local_38 = (value_type *)0x0;
  }
  else {
    local_38 = ImVector<ImDrawCmd>::back(&this->CmdBuffer);
  }
  local_28 = local_38;
  if (((local_38 == (value_type *)0x0) || (local_38->ElemCount != 0)) ||
     (local_38->UserCallback != (ImDrawCallback)0x0)) {
    AddDrawCmd(this);
    local_28 = ImVector<ImDrawCmd>::back(&this->CmdBuffer);
  }
  local_28->UserCallback = callback;
  local_28->UserCallbackData = callback_data;
  AddDrawCmd(this);
  return;
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* current_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!current_cmd || current_cmd->ElemCount != 0 || current_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        current_cmd = &CmdBuffer.back();
    }
    current_cmd->UserCallback = callback;
    current_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}